

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_request_auth_agent(LIBSSH2_CHANNEL *channel,char *request_str,int request_str_len)

{
  uchar uVar1;
  libssh2_nonblocking_states lVar2;
  LIBSSH2_SESSION *session;
  int iVar3;
  char *errmsg;
  uchar *data;
  size_t data_len;
  uchar *local_38;
  
  session = channel->session;
  lVar2 = channel->req_auth_agent_state;
  if (lVar2 == libssh2_NB_state_sent) {
LAB_0010a76f:
    iVar3 = _libssh2_packet_requirev
                      (session,"cd",&data,&data_len,1,channel->req_auth_agent_local_channel,4,
                       &channel->req_auth_agent_requirev_state);
    if (iVar3 == -0x25) {
      return -0x25;
    }
    if (iVar3 != 0) {
      channel->req_auth_agent_state = libssh2_NB_state_idle;
      errmsg = "Failed to request auth-agent";
      iVar3 = -0xe;
      goto LAB_0010a7fb;
    }
    uVar1 = *data;
    (*session->free)(data,&session->abstract);
    channel->req_auth_agent_state = libssh2_NB_state_idle;
    if (uVar1 == 'c') {
      return 0;
    }
  }
  else {
    if (lVar2 == libssh2_NB_state_created) {
LAB_0010a713:
      iVar3 = _libssh2_transport_send
                        (session,channel->req_auth_agent_packet,channel->req_auth_agent_packet_len,
                         (uchar *)0x0,0);
      if (iVar3 != 0) {
        if (iVar3 == -0x25) {
          _libssh2_error(session,-0x25,"Would block sending auth-agent request");
          return -0x25;
        }
        channel->req_auth_agent_state = libssh2_NB_state_idle;
        errmsg = "Unable to send auth-agent request";
        goto LAB_0010a7fb;
      }
      _libssh2_htonu32(channel->req_auth_agent_local_channel,(channel->local).id);
      channel->req_auth_agent_state = libssh2_NB_state_sent;
      goto LAB_0010a76f;
    }
    if (lVar2 == libssh2_NB_state_idle) {
      channel->req_auth_agent_packet_len = (ulong)(request_str_len + 10);
      (channel->req_auth_agent_requirev_state).start = 0;
      local_38 = channel->req_auth_agent_packet + 1;
      channel->req_auth_agent_packet[0] = 'b';
      _libssh2_store_u32(&local_38,(channel->remote).id);
      _libssh2_store_str(&local_38,request_str,(ulong)(uint)request_str_len);
      *local_38 = '\x01';
      channel->req_auth_agent_state = libssh2_NB_state_created;
      local_38 = local_38 + 1;
      goto LAB_0010a713;
    }
  }
  errmsg = "Unable to complete request for auth-agent";
  iVar3 = -0x16;
LAB_0010a7fb:
  iVar3 = _libssh2_error(session,iVar3,errmsg);
  return iVar3;
}

Assistant:

static int channel_request_auth_agent(LIBSSH2_CHANNEL *channel,
                                      const char *request_str,
                                      int request_str_len)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *s;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_CHANNEL_SUCCESS, SSH_MSG_CHANNEL_FAILURE, 0 };
    int rc;

    if(channel->req_auth_agent_state == libssh2_NB_state_idle) {
        /* Only valid options are "auth-agent-req" and
         * "auth-agent-req_at_openssh.com" so we make sure it is not
         * actually longer than the longest possible. */
        if(request_str_len > 26) {
            return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                                  "request_str length too large");
        }

        /*
         *  Length: 24 or 36 = packet_type(1) + channel(4) + req_len(4) +
         *    request_str (variable) + want_reply (1) */
        channel->req_auth_agent_packet_len = 10 + request_str_len;

        /* Zero out the requireev state to reset */
        memset(&channel->req_auth_agent_requirev_state, 0,
               sizeof(channel->req_auth_agent_requirev_state));

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Requesting auth agent on channel %lu/%lu",
                       channel->local.id, channel->remote.id));

        /*
         *  byte      SSH_MSG_CHANNEL_REQUEST
         *  uint32    recipient channel
         *  string    "auth-agent-req"
         *  boolean   want reply
         * */
        s = channel->req_auth_agent_packet;
        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, (char *)request_str, request_str_len);
        *(s++) = 0x01;

        channel->req_auth_agent_state = libssh2_NB_state_created;
    }

    if(channel->req_auth_agent_state == libssh2_NB_state_created) {
        /* Send the packet, we can use sizeof() on the packet because it
         * is always completely filled; there are no variable length fields. */
        rc = _libssh2_transport_send(session, channel->req_auth_agent_packet,
                                     channel->req_auth_agent_packet_len,
                                     NULL, 0);

        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending auth-agent request");
            return rc;
        }
        else if(rc) {
            channel->req_auth_agent_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Unable to send auth-agent request");
        }
        _libssh2_htonu32(channel->req_auth_agent_local_channel,
                         channel->local.id);
        channel->req_auth_agent_state = libssh2_NB_state_sent;
    }

    if(channel->req_auth_agent_state == libssh2_NB_state_sent) {
        unsigned char *data;
        size_t data_len;
        unsigned char code;

        rc = _libssh2_packet_requirev(session, reply_codes, &data, &data_len,
                                      1, channel->req_auth_agent_local_channel,
                                      4,
                                      &channel->req_auth_agent_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            channel->req_auth_agent_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Failed to request auth-agent");
        }

        code = data[0];

        LIBSSH2_FREE(session, data);
        channel->req_auth_agent_state = libssh2_NB_state_idle;

        if(code == SSH_MSG_CHANNEL_SUCCESS)
            return 0;
    }

    return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Unable to complete request for auth-agent");
}